

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool __thiscall cmInstallCommand::CheckCMP0006(cmInstallCommand *this,bool *failure)

{
  cmMakefile *pcVar1;
  PolicyStatus PVar2;
  PolicyID id;
  string local_70;
  string local_40;
  bool *local_20;
  bool *failure_local;
  cmInstallCommand *this_local;
  
  local_20 = failure;
  failure_local = (bool *)this;
  PVar2 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0006,false);
  switch(PVar2) {
  case OLD:
    return true;
  case WARN:
    pcVar1 = (this->super_cmCommand).Makefile;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_40,(cmPolicies *)0x6,id);
    cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    return true;
  case NEW:
    break;
  case REQUIRED_IF_USED:
  case REQUIRED_ALWAYS:
    *local_20 = true;
    pcVar1 = (this->super_cmCommand).Makefile;
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_70,(cmPolicies *)0x6,id);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return false;
}

Assistant:

bool cmInstallCommand::CheckCMP0006(bool& failure)
{
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0006)) {
    case cmPolicies::WARN:
      this->Makefile->IssueMessage(
        MessageType::AUTHOR_WARNING,
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0006));
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // OLD behavior is to allow compatibility
      return true;
    case cmPolicies::NEW:
      // NEW behavior is to disallow compatibility
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      failure = true;
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0006));
      break;
  }
  return false;
}